

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.cpp
# Opt level: O2

void Imf_2_5::Attribute::registerAttributeType(char *typeName,_func_Attribute_ptr *newAttribute)

{
  _Base_ptr p_Var1;
  uint uVar2;
  int iVar3;
  iterator iVar4;
  _Base_ptr *pp_Var5;
  _Rb_tree_node_base *p_Var6;
  pointer p_Var7;
  ostream *poVar8;
  ArgExc *this;
  uint uVar9;
  bool bVar10;
  key_type *__x;
  _Base_ptr p_Var11;
  Lock local_1c8;
  char *typeName_local;
  stringstream _iex_throw_s;
  ostream local_1a0 [376];
  
  __x = (key_type *)newAttribute;
  typeName_local = typeName;
  anon_unknown_0::typeMap();
  local_1c8._mutex = &anon_unknown_0::typeMap::tMap.mutex;
  std::mutex::lock(&anon_unknown_0::typeMap::tMap.mutex);
  local_1c8._locked = true;
  iVar4 = std::
          map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
          ::find((map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
                  *)&typeName_local,__x);
  if ((_Rb_tree_header *)iVar4._M_node !=
      &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar8 = std::operator<<(local_1a0,"Cannot register image file attribute type \"");
    poVar8 = std::operator<<(poVar8,typeName);
    std::operator<<(poVar8,"\". The type has already been registered.");
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(this,(stringstream *)&_iex_throw_s);
    __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  uVar9 = 1;
  pp_Var5 = &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_parent;
  p_Var11 = &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header.
             _M_header;
  while (p_Var1 = *pp_Var5, p_Var1 != (_Base_ptr)0x0) {
    uVar2 = strcmp(typeName,*(char **)(p_Var1 + 1));
    uVar9 = uVar2 >> 0x1f;
    p_Var11 = p_Var1;
    pp_Var5 = &p_Var1->_M_left + (~uVar2 >> 0x1f);
  }
  p_Var6 = p_Var11;
  if (uVar9 == 0) {
LAB_00437ba7:
    iVar3 = strcmp(*(char **)(p_Var6 + 1),typeName);
    if (-1 < iVar3) goto LAB_00437c0d;
  }
  else if (p_Var11 !=
           anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_left) {
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var11);
    goto LAB_00437ba7;
  }
  if ((_Rb_tree_header *)p_Var11 ==
      &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header) {
    bVar10 = true;
  }
  else {
    iVar3 = strcmp(typeName,*(char **)(p_Var11 + 1));
    bVar10 = SUB41((uint)iVar3 >> 0x1f,0);
  }
  p_Var7 = std::
           allocator_traits<std::allocator<std::_Rb_tree_node<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>_>
           ::allocate((allocator_type *)&anon_unknown_0::typeMap::tMap,1);
  *(char **)(p_Var7->_M_storage)._M_storage = typeName;
  *(_func_Attribute_ptr **)((p_Var7->_M_storage)._M_storage + 8) = newAttribute;
  std::_Rb_tree_insert_and_rebalance
            (bVar10,&p_Var7->super__Rb_tree_node_base,p_Var11,
             &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header.
              _M_header);
  anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
       anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header._M_node_count
       + 1;
LAB_00437c0d:
  IlmThread_2_5::Lock::~Lock(&local_1c8);
  return;
}

Assistant:

void	
Attribute::registerAttributeType (const char typeName[],
			          Attribute *(*newAttribute)())
{
    LockedTypeMap& tMap = typeMap();
    Lock lock (tMap.mutex);

    if (tMap.find (typeName) != tMap.end())
	THROW (IEX_NAMESPACE::ArgExc, "Cannot register image file attribute "
			    "type \"" << typeName << "\". "
			    "The type has already been registered.");

    tMap.insert (TypeMap::value_type (typeName, newAttribute));
}